

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

MixMaterial * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::MixMaterial,pbrt::MaterialHandle*&,pbrt::FloatTextureHandle&>
          (polymorphic_allocator<std::byte> *this,MaterialHandle **args,FloatTextureHandle *args_1)

{
  MixMaterial *pMVar1;
  FloatTextureHandle *in_RDX;
  MaterialHandle **in_RSI;
  MixMaterial *in_RDI;
  polymorphic_allocator<std::byte> *unaff_retaddr;
  MixMaterial *p;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffffe0;
  
  pMVar1 = allocate_object<pbrt::MixMaterial>(in_stack_ffffffffffffffe0,(size_t)in_RDI);
  construct<pbrt::MixMaterial,pbrt::MaterialHandle*&,pbrt::FloatTextureHandle&>
            (unaff_retaddr,in_RDI,in_RSI,in_RDX);
  return pMVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }